

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sspm.cpp
# Opt level: O2

int __thiscall pg::SSPMSolver::compare_test(SSPMSolver *this,int pindex)

{
  int iVar1;
  int iVar2;
  uint64_t *puVar3;
  uint64_t *puVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  
  iVar1 = *this->test_d;
  if (*this->tmp_d == -1) {
    uVar6 = (uint)(iVar1 != -1);
  }
  else {
    uVar6 = 0xffffffff;
    if (iVar1 != -1) {
      puVar3 = (this->tmp_b)._bits;
      puVar4 = (this->test_b)._bits;
      uVar7 = 0;
      do {
        if ((uint)(~(this->l >> 0x1f) & this->l) == uVar7) {
          return 0;
        }
        iVar1 = this->tmp_d[uVar7];
        iVar2 = this->test_d[uVar7];
        if (pindex < iVar1 && pindex < iVar2) {
          return 0;
        }
        uVar9 = 1L << (uVar7 & 0x3f);
        if (iVar1 < iVar2) {
          bVar10 = (uVar9 & puVar3[uVar7 >> 6]) == 0;
LAB_00160c0f:
          return -(uint)bVar10 | 1;
        }
        uVar8 = uVar7 >> 6;
        if (iVar2 < iVar1) {
          bVar10 = (uVar9 & puVar4[uVar8]) != 0;
          goto LAB_00160c0f;
        }
        uVar5 = puVar3[uVar8];
        uVar8 = puVar4[uVar8] & uVar9;
        if (((uVar5 & uVar9) == 0) && (uVar8 != 0)) {
          return -1;
        }
        uVar7 = uVar7 + 1;
      } while (((uVar5 & uVar9) == 0) || (uVar8 != 0));
      uVar6 = 1;
    }
  }
  return uVar6;
}

Assistant:

int
SSPMSolver::compare_test(int pindex)
{
    // cases involving Top
    if (tmp_d[0] == -1 and test_d[0] == -1) return 0;
    if (tmp_d[0] == -1) return 1;
    if (test_d[0] == -1) return -1;
    for (int i=0; i<l; i++) {
        if (tmp_d[i] > pindex and test_d[i] > pindex) {
            // equal until pindex, return 0
            return 0;
        } else if (tmp_d[i] < test_d[i]) {
            // equal until test has [eps]
            if (tmp_b[i] == 0) return -1;
            else return 1;
        } else if (tmp_d[i] > test_d[i]) {
            // equal until tmp has [eps]
            if (test_b[i] == 0) return 1;
            else return -1;
        } else if (tmp_b[i] < test_b[i]) {
            // equal until tmp<test
            return -1;
        } else if (tmp_b[i] > test_b[i]) {
            // equal until tmp>test
            return 1;
        }
    }
    return 0;
}